

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O3

bool IsArguments(ParseNode *pnode)

{
  OpCode OVar1;
  code *pcVar2;
  bool bVar3;
  bool bVar4;
  uint uVar5;
  undefined4 *puVar6;
  ParseNodeCall *pPVar7;
  ParseNodeArrLit *pPVar8;
  ParseNodeTri *pPVar9;
  ParseNodeBin *pPVar10;
  ParseNodeUni *pPVar11;
  ParseNodeName *pPVar12;
  uint nop;
  ParseNodePtr pnode_00;
  ParseNodePtr *ppPVar13;
  
  puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
LAB_007f8d56:
  OVar1 = pnode->nop;
  bVar4 = true;
  nop = (uint)OVar1;
  if (OVar1 < knopObject) {
    if (OVar1 != knopArray) {
      if (OVar1 != knopName) {
        if (nop == 0x16) {
          return true;
        }
        goto switchD_007f8d75_caseD_30;
      }
      pPVar12 = ParseNode::AsParseNodeName(pnode);
      if (pPVar12->sym != (Symbol *)0x0) {
        pPVar12 = ParseNode::AsParseNodeName(pnode);
        bVar4 = Symbol::IsArguments(pPVar12->sym);
        return bVar4;
      }
LAB_007f8f8a:
      bVar4 = false;
switchD_007f8d75_caseD_50:
      return bVar4;
    }
    pPVar8 = ParseNode::AsParseNodeArrLit(pnode);
    if (((pPVar8->field_0x20 & 4) != 0) ||
       (pPVar8 = ParseNode::AsParseNodeArrLit(pnode), pPVar8->count == 0)) goto LAB_007f8f8a;
    pPVar11 = ParseNode::AsParseNodeUni(pnode);
    ppPVar13 = &pPVar11->pnode1;
  }
  else {
    switch(OVar1) {
    case knopCall:
    case knopNew:
      pPVar7 = ParseNode::AsParseNodeCall(pnode);
      bVar4 = IsArguments(pPVar7->pnodeTarget);
      if (bVar4) {
        return true;
      }
      pPVar7 = ParseNode::AsParseNodeCall(pnode);
      if (pPVar7->pnodeArgs != (ParseNodePtr)0x0) goto code_r0x007f8da3;
      goto LAB_007f8f8a;
    case knopDot:
    case knopAsg:
    case knopInstOf:
    case knopIn:
    case knopEqv:
    case knopNEqv:
    case knopComma:
    case knopLogOr:
    case knopLogAnd:
    case knopCoalesce:
    case knopLsh:
    case knopRsh:
    case knopRs2:
    case knopIndex:
    case knopAsgAdd:
    case knopAsgSub:
    case knopAsgMul:
    case knopAsgDiv:
    case knopAsgExpo:
    case knopAsgMod:
    case knopAsgAnd:
    case knopAsgXor:
    case knopAsgOr:
    case knopAsgLsh:
    case knopAsgRsh:
    case knopAsgRs2:
    case knopMember:
    case knopMemberShort:
    case knopSetMember:
    case knopGetMember:
    case knopTemp:
    case knopProg:
    case knopModule:
    case knopEndCode:
    case knopDebugger:
    case knopStrTemplate:
    case knopSwitch:
    case knopCase:
    case knopCatch:
    case knopObjectPatternMember:
      goto switchD_007f8d75_caseD_30;
    case knopQmark:
      pPVar9 = ParseNode::AsParseNodeTri(pnode);
      bVar3 = IsArguments(pPVar9->pnode1);
      if (!bVar3) {
        pPVar9 = ParseNode::AsParseNodeTri(pnode);
        bVar3 = IsArguments(pPVar9->pnode2);
        if (!bVar3) {
          pPVar9 = ParseNode::AsParseNodeTri(pnode);
          ppPVar13 = &pPVar9->pnode3;
          goto LAB_007f8f53;
        }
      }
    case knopList:
    case knopVarDecl:
    case knopConstDecl:
    case knopLetDecl:
    case knopFncDecl:
    case knopClassDecl:
    case knopFor:
    case knopIf:
    case knopWhile:
    case knopDoWhile:
    case knopForIn:
    case knopForOf:
    case knopForAwaitOf:
    case knopBlock:
    case knopWith:
    case knopBreak:
    case knopContinue:
    case knopTryCatch:
    case knopReturn:
    case knopTry:
    case knopThrow:
    case knopFinally:
    case knopTryFinally:
    case knopObjectPattern:
    case knopArrayPattern:
    case knopParamPattern:
      goto switchD_007f8d75_caseD_50;
    }
    if (nop == 0x1a) {
      return true;
    }
switchD_007f8d75_caseD_30:
    uVar5 = ParseNode::Grfnop(nop);
    if ((uVar5 & 4) == 0) {
      if ((uVar5 & 8) == 0) goto LAB_007f8f8a;
      pPVar10 = ParseNode::AsParseNodeBin(pnode);
      pnode_00 = pPVar10->pnode1;
      if ((pnode_00 == (ParseNodePtr)0x0) || (pPVar10->pnode2 == (ParseNodePtr)0x0)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar6 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                           ,0xeb,"(pnodeBin->pnode1 && pnodeBin->pnode2)",
                           "pnodeBin->pnode1 && pnodeBin->pnode2");
        if (!bVar4) goto LAB_007f8f9f;
        *puVar6 = 0;
        pnode_00 = pPVar10->pnode1;
      }
      bVar4 = IsArguments(pnode_00);
      if (bVar4) {
        return true;
      }
      ppPVar13 = &pPVar10->pnode2;
    }
    else {
      pPVar11 = ParseNode::AsParseNodeUni(pnode);
      pnode = pPVar11->pnode1;
      if (pnode != (ParseNodePtr)0x0) goto LAB_007f8d56;
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar6 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                         ,0xe3,"(pnodeUni->pnode1)","pnodeUni->pnode1");
      if (!bVar4) {
LAB_007f8f9f:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      ppPVar13 = &pPVar11->pnode1;
      *puVar6 = 0;
    }
  }
LAB_007f8f53:
  pnode = *ppPVar13;
  goto LAB_007f8d56;
code_r0x007f8da3:
  pPVar7 = ParseNode::AsParseNodeCall(pnode);
  while (pnode = pPVar7->pnodeArgs, pnode->nop == knopList) {
    pPVar10 = ParseNode::AsParseNodeBin(pnode);
    bVar4 = IsArguments(pPVar10->pnode1);
    if (bVar4) {
      return true;
    }
    pPVar7 = (ParseNodeCall *)ParseNode::AsParseNodeBin(pnode);
  }
  goto LAB_007f8d56;
}

Assistant:

bool IsArguments(ParseNode *pnode)
{
    for (;;)
    {
        switch (pnode->nop)
        {
        case knopName:
            return pnode->AsParseNodeName()->sym && pnode->AsParseNodeName()->sym->IsArguments();

        case knopCall:
        case knopNew:
            if (IsArguments(pnode->AsParseNodeCall()->pnodeTarget))
            {
                return true;
            }

            if (pnode->AsParseNodeCall()->pnodeArgs)
            {
                ParseNode *pnodeArg = pnode->AsParseNodeCall()->pnodeArgs;
                while (pnodeArg->nop == knopList)
                {
                    if (IsArguments(pnodeArg->AsParseNodeBin()->pnode1))
                        return true;

                    pnodeArg = pnodeArg->AsParseNodeBin()->pnode2;
                }

                pnode = pnodeArg;
                break;
            }

            return false;

        case knopArray:
            if (pnode->AsParseNodeArrLit()->arrayOfNumbers || pnode->AsParseNodeArrLit()->count == 0)
            {
                return false;
            }

            pnode = pnode->AsParseNodeUni()->pnode1;
            break;

        case knopQmark:
            if (IsArguments(pnode->AsParseNodeTri()->pnode1) || IsArguments(pnode->AsParseNodeTri()->pnode2))
            {
                return true;
            }

            pnode = pnode->AsParseNodeTri()->pnode3;
            break;

            //
            // Cases where we don't check for "arguments" yet.
            // Assume that they might have it. Disable the optimization in such scenarios
            //
        case knopList:
        case knopObject:
        case knopVarDecl:
        case knopConstDecl:
        case knopLetDecl:
        case knopFncDecl:
        case knopClassDecl:
        case knopFor:
        case knopIf:
        case knopDoWhile:
        case knopWhile:
        case knopForIn:
        case knopForOf:
        case knopForAwaitOf:
        case knopReturn:
        case knopBlock:
        case knopBreak:
        case knopContinue:
        case knopTypeof:
        case knopThrow:
        case knopWith:
        case knopFinally:
        case knopTry:
        case knopTryCatch:
        case knopTryFinally:
        case knopArrayPattern:
        case knopObjectPattern:
        case knopParamPattern:
            return true;

        default:
        {
            uint flags = ParseNode::Grfnop(pnode->nop);
            if (flags&fnopUni)
            {
                ParseNodeUni * pnodeUni = pnode->AsParseNodeUni();
                Assert(pnodeUni->pnode1);

                pnode = pnodeUni->pnode1;
                break;
            }
            else if (flags&fnopBin)
            {
                ParseNodeBin * pnodeBin = pnode->AsParseNodeBin();
                Assert(pnodeBin->pnode1 && pnodeBin->pnode2);

                if (IsArguments(pnodeBin->pnode1))
                {
                    return true;
                }

                pnode = pnodeBin->pnode2;
                break;
            }

            return false;
        }

        }
    }
}